

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_widget_is_hovered(nk_context *ctx)

{
  int iVar1;
  nk_rect bounds;
  nk_rect local_18;
  
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    nk_layout_peek(&local_18,ctx);
    if (ctx->active == ctx->current) {
      iVar1 = nk_input_is_mouse_hovering_rect(&ctx->input,local_18);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
    return ret;
}